

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O0

void findSwitches(string *filename,string *outfile,string *reference)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  ostream *poVar6;
  runtime_error *this;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var7;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var8;
  ulong uVar9;
  size_type sVar10;
  reference pvVar11;
  pointer ppVar12;
  double stat_1;
  iterator it3;
  double stat;
  iterator it;
  ofstream RSSwitchFile;
  ofstream FSSwitchFile;
  int i_1;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codes_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codes;
  bool strand1;
  vector<int,_std::allocator<int>_> qualityList;
  string alignSequence;
  string constructedReference;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref;
  uint s;
  CigarOp *it_1;
  iterator __end2;
  iterator __begin2;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range2;
  vector<char,_std::allocator<char>_> cigar;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indRSTotalScores;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSReadScoresFrequency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSQualCodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSCodes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indFSTotalScores;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSReadScoresFrequency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSQualCodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSCodes;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  RSSwitchMap;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  FSSwitchMap;
  BamAlignment alignment;
  BamReader bamreader;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffff378;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff380;
  undefined4 in_stack_fffffffffffff384;
  value_type *in_stack_fffffffffffff388;
  ostream *in_stack_fffffffffffff390;
  char *in_stack_fffffffffffff3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a8;
  string *in_stack_fffffffffffff3c8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff3d0;
  _Self local_b30;
  _Base_ptr local_b28;
  _Self local_b20;
  double local_b18;
  _Self local_b10;
  _Base_ptr local_b08;
  _Self local_b00;
  string *in_stack_fffffffffffff508;
  string *in_stack_fffffffffffff510;
  string *in_stack_fffffffffffff518;
  int in_stack_fffffffffffff524;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff528;
  ostream local_ab8 [192];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffff608;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffff610;
  undefined7 in_stack_fffffffffffff618;
  char in_stack_fffffffffffff61f;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffff620;
  string *in_stack_fffffffffffff628;
  string *in_stack_fffffffffffff630;
  string *in_stack_fffffffffffff638;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffff640;
  char in_stack_fffffffffffff650;
  char in_stack_fffffffffffff658;
  ostream local_8b8 [119];
  char in_stack_fffffffffffff7bf;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffff7c0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  char in_stack_fffffffffffff7f0;
  char in_stack_fffffffffffff7f8;
  string local_6b8 [32];
  string local_698 [36];
  int local_674;
  string local_670 [32];
  string local_650 [36];
  int local_62c;
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_590 [2];
  string local_560 [32];
  string local_540 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_520;
  byte local_501;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [148];
  uint local_3f4;
  reference local_3f0;
  CigarOp *local_3e8;
  __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_3e0;
  undefined1 *local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> local_208 [48];
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> local_1d8 [48];
  BamAlignment local_1a8 [40];
  string local_180 [64];
  string local_140 [80];
  undefined1 auStack_f0 [160];
  string local_50 [48];
  BamReader local_20 [32];
  
  BamTools::BamReader::BamReader(local_20);
  bVar4 = BamTools::BamReader::Open((string *)local_20);
  if ((bVar4 & 1) == 0) {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar6 = std::operator<<((ostream *)&std::cerr,local_50);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment(local_1a8);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x114ba2);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x114baf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x114bbc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x114bc9);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114bd6)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114be3)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114bf0)
  ;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x114bfd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x114c0a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x114c17);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114c24)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114c31)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114c3e)
  ;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x114c4b);
  while (bVar4 = BamTools::BamReader::GetNextAlignment((BamAlignment *)local_20), (bVar4 & 1) != 0)
  {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x114c86);
    local_3d8 = auStack_f0;
    local_3e0._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   (in_stack_fffffffffffff378);
    local_3e8 = (CigarOp *)
                std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                          (in_stack_fffffffffffff378);
    while (bVar5 = __gnu_cxx::operator!=
                             ((__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380),
                              (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffff378), bVar5) {
      local_3f0 = __gnu_cxx::
                  __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                  ::operator*(&local_3e0);
      for (local_3f4 = 0; local_3f4 < *(uint *)(local_3f0 + 4); local_3f4 = local_3f4 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff390,
                   (value_type_conflict *)in_stack_fffffffffffff388);
      }
      __gnu_cxx::
      __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_3e0);
    }
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffff3d0,
               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3c8);
    std::__cxx11::string::string(local_488,local_180);
    std::__cxx11::string::string(local_4a8,local_140);
    referenceString(in_stack_fffffffffffff528,in_stack_fffffffffffff524,in_stack_fffffffffffff518,
                    in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_488);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff390);
    p_Var7 = std::
             get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x114e57);
    std::__cxx11::string::string(local_4c8,(string *)p_Var7);
    p_Var8 = std::
             get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x114e76);
    std::__cxx11::string::string(local_4e8,(string *)p_Var8);
    std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)0x114e95);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3d0,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3c8);
    bVar4 = BamTools::BamAlignment::IsPaired();
    if ((bVar4 & 1) == 0) {
      bVar4 = BamTools::BamAlignment::IsReverseStrand();
      local_501 = (bVar4 ^ 0xff) & 1;
    }
    else {
      bVar4 = BamTools::BamAlignment::IsFirstMate();
      if ((bVar4 & 1) == 0) {
        bVar4 = BamTools::BamAlignment::IsSecondMate();
        if ((bVar4 & 1) != 0) {
          bVar4 = BamTools::BamAlignment::IsReverseStrand();
          local_501 = (bVar4 & 1) != 0;
        }
      }
      else {
        bVar4 = BamTools::BamAlignment::IsReverseStrand();
        local_501 = (bVar4 & 1) == 0;
      }
    }
    if ((local_501 & 1) == 0) {
      if ((local_501 & 1) == 0) {
        std::__cxx11::string::string(local_5d0,local_4c8);
        uVar13 = (undefined4)((ulong)in_stack_fffffffffffff378 >> 0x20);
        complement(in_stack_fffffffffffff3c8);
        std::__cxx11::string::string(local_610,local_4e8);
        complement(in_stack_fffffffffffff3c8);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3d0,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3c8);
        in_stack_fffffffffffff380 = 0x54;
        in_stack_fffffffffffff378 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)CONCAT44(uVar13,0x43);
        RFSAndRRSSwitchDetermination
                  (in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff628,
                   in_stack_fffffffffffff620,in_stack_fffffffffffff61f,in_stack_fffffffffffff650,
                   in_stack_fffffffffffff658);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff390);
        std::__cxx11::string::~string(local_5f0);
        std::__cxx11::string::~string(local_610);
        std::__cxx11::string::~string(local_5b0);
        std::__cxx11::string::~string(local_5d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_590,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_590,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff390);
      }
    }
    else {
      std::__cxx11::string::string(local_540,local_4c8);
      uVar13 = (undefined4)((ulong)in_stack_fffffffffffff378 >> 0x20);
      std::__cxx11::string::string(local_560,local_4e8);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3d0,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff3c8);
      in_stack_fffffffffffff380 = 0x54;
      in_stack_fffffffffffff378 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)CONCAT44(uVar13,0x43);
      FFSAndFRSSwitchDetermination
                (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                 in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bf,in_stack_fffffffffffff7f0,
                 in_stack_fffffffffffff7f8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff390);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_540);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_520,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_520,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff390);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff390);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_4c8);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
              *)0x115498);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff390);
  }
  for (local_62c = 0; uVar9 = (ulong)local_62c,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_220), uVar9 < sVar10; local_62c = local_62c + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_220,(long)local_62c);
    std::__cxx11::string::string(local_650,(string *)pvVar11);
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_238,(long)local_62c);
    std::__cxx11::string::string(local_670,(string *)pvVar11);
    in_stack_fffffffffffff378 = local_1d8;
    scoreIndividualReads
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               in_stack_fffffffffffff620,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff640);
    std::__cxx11::string::~string(local_670);
    std::__cxx11::string::~string(local_650);
  }
  for (local_674 = 0; uVar9 = (ulong)local_674,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_2f8), uVar9 < sVar10; local_674 = local_674 + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_2f8,(long)local_674);
    std::__cxx11::string::string(local_698,(string *)pvVar11);
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_310,(long)local_674);
    std::__cxx11::string::string(local_6b8,(string *)pvVar11);
    in_stack_fffffffffffff378 = local_208;
    scoreIndividualReads
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               in_stack_fffffffffffff620,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff640);
    std::__cxx11::string::~string(local_6b8);
    std::__cxx11::string::~string(local_698);
  }
  std::ofstream::ofstream(local_8b8);
  std::ofstream::ofstream(local_ab8);
  std::operator+(in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::ofstream::open(local_8b8,&stack0xfffffffffffff528,0x10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff528);
  std::operator+(in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::ofstream::open(local_ab8,&stack0xfffffffffffff508,0x10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff508);
  local_b00._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
       ::begin((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                *)in_stack_fffffffffffff378);
  local_b08 = (_Base_ptr)
              std::
              map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
              ::begin((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                       *)in_stack_fffffffffffff378);
  local_b00._M_node = local_b08;
  while( true ) {
    local_b10._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         ::end((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                *)in_stack_fffffffffffff378);
    bVar5 = std::operator!=(&local_b00,&local_b10);
    if (!bVar5) break;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x1158ae)
    ;
    iVar1 = (ppVar12->second).first;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x1158c9)
    ;
    iVar2 = (ppVar12->second).second;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x1158e0)
    ;
    local_b18 = (double)iVar1 / (double)(iVar2 + (ppVar12->second).first);
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115916)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(local_8b8,ppVar12->first);
    poVar6 = std::operator<<(poVar6,"    ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b18);
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x1159a0)
    ;
    iVar1 = (ppVar12->second).second;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x1159b7)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1 + (ppVar12->second).first);
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115a05)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ppVar12->second).first);
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115a4a)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ppVar12->second).second);
    std::operator<<(poVar6,'\n');
    std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
  }
  local_b20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
       ::begin((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                *)in_stack_fffffffffffff378);
  local_b28 = (_Base_ptr)
              std::
              map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
              ::begin((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                       *)in_stack_fffffffffffff378);
  local_b20._M_node = local_b28;
  while( true ) {
    local_b30._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         ::end((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                *)in_stack_fffffffffffff378);
    bVar5 = std::operator!=(&local_b20,&local_b30);
    if (!bVar5) break;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115b89)
    ;
    iVar1 = (ppVar12->second).first;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115b9e)
    ;
    iVar2 = (ppVar12->second).second;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115baf)
    ;
    iVar3 = (ppVar12->second).first;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115bdc)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(local_ab8,ppVar12->first);
    poVar6 = std::operator<<(poVar6,"    ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)iVar1 / (double)(iVar2 + iVar3));
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115c54)
    ;
    iVar1 = (ppVar12->second).second;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115c65)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1 + (ppVar12->second).first);
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115ca4)
    ;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ppVar12->second).first);
    poVar6 = std::operator<<(poVar6,"    ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x115cdd)
    ;
    in_stack_fffffffffffff390 = (ostream *)std::ostream::operator<<(poVar6,(ppVar12->second).second)
    ;
    std::operator<<(in_stack_fffffffffffff390,'\n');
    std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
  }
  std::ofstream::~ofstream(local_ab8);
  std::ofstream::~ofstream(local_8b8);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff390);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115d4a)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115d57)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115d64)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff390);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff390);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115d98)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115da5)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x115db2)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff390);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::~map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
          *)0x115dd9);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::~map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
          *)0x115de6);
  BamTools::BamAlignment::~BamAlignment(local_1a8);
  BamTools::BamReader::~BamReader(local_20);
  return;
}

Assistant:

void findSwitches(string filename , string outfile, string & reference) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;
    std::map<int,std::pair<int,int>> FSSwitchMap;// map containg switch and nonswitch values for FS reads
    std::map<int,std::pair<int,int>> RSSwitchMap;// map containg switch and nonswitch values for RS reads
    vector<string> FSCodes;
    vector<string> FSQualCodes;
    std::map<int,int> FSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indFSTotalScores;// vector contating the individual score for FS reads
    vector<string> RSCodes;
    vector<string> RSQualCodes;
    std::map<int,int> RSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indRSTotalScores;// map contating the individual score for RS reads

    while (bamreader.GetNextAlignment(alignment)){
        std::vector<char> cigar;
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar.push_back(it.Type);
            }
        }
        std::tuple<string,string,vector<int>> ref = referenceString(cigar,alignment.Position,alignment.QueryBases,reference,alignment.Qualities);
        string constructedReference = std::get<0>(ref);
        string alignSequence = std::get<1>(ref);
        vector<int> qualityList = std::get<2>(ref);


        bool strand1;
        if(!alignment.IsPaired()){
        strand1 = !alignment.IsReverseStrand();
        }else{
            if(alignment.IsFirstMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=true;
                }else{
                    strand1=false;
                }
            }else if(alignment.IsSecondMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=false;
                }else{
                    strand1=true;
                }
            }
        }

        // All the reads in a bam file are stored in the forward direction. So for OT and CTOT we dont chenge anything since they are forward reads
        // For OB and CTOB we take the compliment of both since we want both to be aligned to the reverse strand
        if(strand1){//OT nad CTOT
            vector<string> codes= FFSAndFRSSwitchDetermination(constructedReference,alignSequence,qualityList,FSSwitchMap,'G','C','T');
            FSCodes.push_back(codes[0]);
            FSQualCodes.push_back(codes[1]);
        }else if(!strand1){//OB and CTOB
            vector<string> codes= RFSAndRRSSwitchDetermination(complement(constructedReference),complement(alignSequence),qualityList,RSSwitchMap,'G','C','T');
            RSCodes.push_back(codes[0]);
            RSQualCodes.push_back(codes[1]);
        }


    }

    //Scoring forward strand reads
    for(int i = 0; i<FSCodes.size(); i++){
        scoreIndividualReads(FSCodes[i],FSQualCodes[i],FSReadScoresFrequency,FSSwitchScoresFrequency,FSQualScoresFrequency,indFSTotalScores,FSSwitchMap);
    }
    //Scoring reverse strand reads
    for(int i = 0; i<RSCodes.size(); i++){
        scoreIndividualReads(RSCodes[i],RSQualCodes[i],RSReadScoresFrequency,RSSwitchScoresFrequency,RSQualScoresFrequency,indRSTotalScores,RSSwitchMap);
    }



    ofstream FSSwitchFile;
    ofstream RSSwitchFile;

    FSSwitchFile.open (outfile+"FSSwitches.txt");
    RSSwitchFile.open (outfile+"RSSwitches.txt");

    //Outfile(switchrates) format: distance | switch/switch+nonSwitch | switch+nonSwitch | switch | nonSwitch

    std::map<int,std::pair<int,int>>::iterator it = FSSwitchMap.begin();
    for (it=FSSwitchMap.begin(); it!=FSSwitchMap.end(); ++it){
        double stat;
        stat = it->second.first/(double)(it->second.second+it->second.first);
        FSSwitchFile << it->first << "    " << stat <<"    "<<it->second.second+it->second.first<<"    "<<it->second.first<<"    "<<it->second.second<< '\n';

    }


    std::map<int,std::pair<int,int>>::iterator it3 = RSSwitchMap.begin();
    for (it3=RSSwitchMap.begin(); it3!=RSSwitchMap.end(); ++it3){
        double stat;
        stat = it3->second.first/(double)(it3->second.second+it3->second.first);
        RSSwitchFile << it3->first << "    " << stat <<"    "<<it3->second.second+it3->second.first<<"    "<<it3->second.first<<"    "<<it3->second.second<< '\n';

    }

}